

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003a73e0 == '\x01') {
    DAT_003a73e0 = '\0';
    (*(code *)*_LinearKernel_default_instance_)();
  }
  if (DAT_003a7408 == '\x01') {
    DAT_003a7408 = '\0';
    (*(code *)*_RBFKernel_default_instance_)();
  }
  if (DAT_003a7438 == '\x01') {
    DAT_003a7438 = '\0';
    (*(code *)*_PolyKernel_default_instance_)();
  }
  if (DAT_003a7468 == '\x01') {
    DAT_003a7468 = '\0';
    (*(code *)*_SigmoidKernel_default_instance_)();
  }
  if (DAT_003a7490 == '\x01') {
    DAT_003a7490 = '\0';
    (*(code *)*_Kernel_default_instance_)();
  }
  if (DAT_003a74d8 == '\x01') {
    DAT_003a74d8 = '\0';
    (*(code *)*_SparseNode_default_instance_)();
  }
  if (DAT_003a7510 == '\x01') {
    DAT_003a7510 = '\0';
    (*(code *)*_SparseVector_default_instance_)();
  }
  if (DAT_003a7548 == '\x01') {
    DAT_003a7548 = '\0';
    (*(code *)*_SparseSupportVectors_default_instance_)();
  }
  if (DAT_003a7578 == '\x01') {
    DAT_003a7578 = '\0';
    (*(code *)*_DenseVector_default_instance_)();
  }
  if (DAT_003a75b0 == '\x01') {
    DAT_003a75b0 = '\0';
    (*(code *)*_DenseSupportVectors_default_instance_)();
  }
  if (DAT_003a75e0 == '\x01') {
    DAT_003a75e0 = '\0';
    (*(code *)*_Coefficients_default_instance_)();
  }
  if (DAT_003a7620 == '\x01') {
    DAT_003a7620 = '\0';
    (*(code *)*_SupportVectorRegressor_default_instance_)();
  }
  if (DAT_003a76e8 == '\x01') {
    DAT_003a76e8 = 0;
    (*(code *)*_SupportVectorClassifier_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinearKernel_default_instance_.Shutdown();
  _RBFKernel_default_instance_.Shutdown();
  _PolyKernel_default_instance_.Shutdown();
  _SigmoidKernel_default_instance_.Shutdown();
  _Kernel_default_instance_.Shutdown();
  _SparseNode_default_instance_.Shutdown();
  _SparseVector_default_instance_.Shutdown();
  _SparseSupportVectors_default_instance_.Shutdown();
  _DenseVector_default_instance_.Shutdown();
  _DenseSupportVectors_default_instance_.Shutdown();
  _Coefficients_default_instance_.Shutdown();
  _SupportVectorRegressor_default_instance_.Shutdown();
  _SupportVectorClassifier_default_instance_.Shutdown();
}